

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vertexClustering.cpp
# Opt level: O0

void __thiscall
VertexClustering::pushNeighbors
          (VertexClustering *this,VCFace *f,VCEdge *e,
          queue<VCEdge,_std::deque<VCEdge,_std::allocator<VCEdge>_>_> *q)

{
  bool bVar1;
  value_type *__x;
  mapped_type *pmVar2;
  queue<VCEdge,_std::deque<VCEdge,_std::allocator<VCEdge>_>_> *this_00;
  VCEdge *in_RDX;
  int *in_RSI;
  long in_RDI;
  VCEdge e3;
  VCEdge e2;
  VCEdge e1;
  VCPair local_68;
  VCFace *local_60;
  VCFace *local_58;
  VCPair local_50;
  VCFace *in_stack_ffffffffffffffb8;
  VCFace *__k;
  VCFace *in_stack_ffffffffffffffc0;
  VCFace *this_01;
  VCPair local_38;
  VCEdge local_30;
  VCEdge *local_18;
  int *local_10;
  
  __x = (value_type *)(in_RDI + 0x28);
  local_18 = in_RDX;
  local_10 = in_RSI;
  VCPair::VCPair(&local_38,*in_RSI,in_RSI[1]);
  pmVar2 = std::
           map<VCPair,_VCEdge,_VCEdgeItemCmp,_std::allocator<std::pair<const_VCPair,_VCEdge>_>_>::
           operator[]((map<VCPair,_VCEdge,_VCEdgeItemCmp,_std::allocator<std::pair<const_VCPair,_VCEdge>_>_>
                       *)in_stack_ffffffffffffffc0,(key_type *)in_stack_ffffffffffffffb8);
  local_30.f1 = pmVar2->f1;
  local_30.f2 = pmVar2->f2;
  this_00 = (queue<VCEdge,_std::deque<VCEdge,_std::allocator<VCEdge>_>_> *)(in_RDI + 0x28);
  VCPair::VCPair(&local_50,*local_10,local_10[2]);
  pmVar2 = std::
           map<VCPair,_VCEdge,_VCEdgeItemCmp,_std::allocator<std::pair<const_VCPair,_VCEdge>_>_>::
           operator[]((map<VCPair,_VCEdge,_VCEdgeItemCmp,_std::allocator<std::pair<const_VCPair,_VCEdge>_>_>
                       *)in_stack_ffffffffffffffc0,(key_type *)in_stack_ffffffffffffffb8);
  __k = pmVar2->f1;
  this_01 = pmVar2->f2;
  VCPair::VCPair(&local_68,local_10[1],local_10[2]);
  pmVar2 = std::
           map<VCPair,_VCEdge,_VCEdgeItemCmp,_std::allocator<std::pair<const_VCPair,_VCEdge>_>_>::
           operator[]((map<VCPair,_VCEdge,_VCEdgeItemCmp,_std::allocator<std::pair<const_VCPair,_VCEdge>_>_>
                       *)this_01,(key_type *)__k);
  local_60 = pmVar2->f1;
  local_58 = pmVar2->f2;
  bVar1 = VCEdge::operator==(&local_30,local_18);
  if (bVar1) {
    std::queue<VCEdge,_std::deque<VCEdge,_std::allocator<VCEdge>_>_>::push(this_00,__x);
    std::queue<VCEdge,_std::deque<VCEdge,_std::allocator<VCEdge>_>_>::push(this_00,__x);
  }
  else {
    bVar1 = VCEdge::operator==((VCEdge *)&stack0xffffffffffffffb8,local_18);
    if (bVar1) {
      std::queue<VCEdge,_std::deque<VCEdge,_std::allocator<VCEdge>_>_>::push(this_00,__x);
      std::queue<VCEdge,_std::deque<VCEdge,_std::allocator<VCEdge>_>_>::push(this_00,__x);
    }
    else {
      std::queue<VCEdge,_std::deque<VCEdge,_std::allocator<VCEdge>_>_>::push(this_00,__x);
      std::queue<VCEdge,_std::deque<VCEdge,_std::allocator<VCEdge>_>_>::push(this_00,__x);
    }
  }
  return;
}

Assistant:

void VertexClustering::pushNeighbors(VCFace *f, VCEdge& e, queue<VCEdge>* q)
{
	VCEdge e1(edgeMap[VCPair(f->v1, f->v2)]);
	VCEdge e2(edgeMap[VCPair(f->v1, f->v3)]);
	VCEdge e3(edgeMap[VCPair(f->v2, f->v3)]);
	if (e1 == e) {
		q->push(e2);
		q->push(e3);
	}
	else if (e2 == e) {
		q->push(e1);
		q->push(e3);
	}
	else {
		q->push(e1);
		q->push(e2);
	}
}